

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int select_cipher(ptls_cipher_suite_t **selected,ptls_cipher_suite_t **candidates,uint8_t *src,
                 uint8_t *end)

{
  int iVar1;
  ptls_cipher_suite_t **pppVar2;
  uint16_t in_R8W;
  int iVar3;
  int iVar4;
  long lVar5;
  ptls_cipher_suite_t *ppVar6;
  
  do {
    if (src == end) {
      return 0x28;
    }
    lVar5 = (long)end - (long)src;
    iVar3 = 0x32;
    if (1 < lVar5) {
      in_R8W = *(ushort *)src << 8 | *(ushort *)src >> 8;
      src = (uint8_t *)((long)src + 2);
      iVar3 = 0;
    }
    iVar4 = 4;
    if (1 < lVar5) {
      iVar4 = 0;
      ppVar6 = *candidates;
      pppVar2 = candidates + 1;
      while (ppVar6 != (ptls_cipher_suite_t *)0x0) {
        if (ppVar6->id == in_R8W) {
          *selected = ppVar6;
          iVar4 = 1;
          break;
        }
        ppVar6 = *pppVar2;
        pppVar2 = pppVar2 + 1;
      }
    }
    if (iVar4 != 0) {
      iVar1 = 0;
      if (iVar4 == 4) {
        iVar1 = iVar3;
      }
      return iVar1;
    }
  } while( true );
}

Assistant:

static int select_cipher(ptls_cipher_suite_t **selected, ptls_cipher_suite_t **candidates, const uint8_t *src,
                         const uint8_t *const end)
{
    int ret;

    while (src != end) {
        uint16_t id;
        if ((ret = ptls_decode16(&id, &src, end)) != 0)
            goto Exit;
        ptls_cipher_suite_t **c = candidates;
        for (; *c != NULL; ++c) {
            if ((*c)->id == id) {
                *selected = *c;
                return 0;
            }
        }
    }

    ret = PTLS_ALERT_HANDSHAKE_FAILURE;

Exit:
    return ret;
}